

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<short>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<short> min,WrappedType<short> max,float gridSize)

{
  short sVar1;
  int iVar2;
  Short SVar3;
  Short SVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  short sVar14;
  int iVar15;
  long lVar16;
  Short min_00;
  short sVar17;
  int iVar18;
  ulong uVar19;
  int unaff_R12D;
  int iVar20;
  short sVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  uint uVar25;
  float fVar26;
  short local_c0;
  short local_a8;
  deRandom rnd;
  
  iVar5 = componentCount * 2;
  if (stride != 0) {
    iVar5 = stride;
  }
  iVar6 = iVar5 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar6 = 0;
  }
  pcVar8 = (char *)operator_new__((long)(iVar6 * count + offset));
  deRandom_init(&rnd,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar26 = (float)(int)max.m_value - (float)(int)min.m_value;
    uVar25 = -(uint)(-fVar26 <= fVar26);
    uVar7 = (uint)((float)(~uVar25 & (uint)-fVar26 | (uint)fVar26 & uVar25) * gridSize);
    uVar25 = 0x400;
    if (0x400 < (short)uVar7) {
      uVar25 = uVar7;
    }
    uVar7 = uVar25 & 0xffff;
    min_00.m_value = (short)uVar25;
    iVar9 = iVar5 * 4;
    uVar19 = 0;
    uVar22 = (ulong)(uint)count;
    if (count < 1) {
      uVar22 = 0;
    }
    iVar2 = iVar5 * 5;
    iVar20 = 4;
    iVar18 = 6;
    uVar23 = uVar22;
    iVar13 = iVar9;
    iVar11 = iVar2;
    iVar12 = iVar2;
    iVar10 = iVar2;
    for (; uVar19 != uVar22; uVar19 = uVar19 + 1) {
      iVar15 = 4;
      do {
        do {
          bVar24 = iVar15 == 0;
          iVar15 = iVar15 + -1;
          if (bVar24) goto LAB_014f0458;
          SVar3 = getRandom<deqp::gls::GLValue::WrappedType<short>>(&rnd,min.m_value,max.m_value);
          iVar10 = (uint)(ushort)SVar3.m_value - (int)SVar3.m_value % (int)uVar7;
          SVar3 = getRandom<deqp::gls::GLValue::WrappedType<short>>
                            (&rnd,min_00,(Short)(max.m_value - (short)iVar10 & 0x7fff));
          iVar11 = (uint)(ushort)SVar3.m_value - (int)SVar3.m_value % (int)uVar7;
          SVar3 = getRandom<deqp::gls::GLValue::WrappedType<short>>(&rnd,min.m_value,max.m_value);
          uVar25 = (uint)(ushort)SVar3.m_value - (int)SVar3.m_value % (int)uVar7;
          uVar23 = (ulong)uVar25;
          SVar3 = getRandom<deqp::gls::GLValue::WrappedType<short>>
                            (&rnd,min_00,(Short)(max.m_value - (short)uVar25 & 0x7fff));
          iVar12 = (uint)(ushort)SVar3.m_value - (int)SVar3.m_value % (int)uVar7;
          if (componentCount < 3) {
            unaff_R12D = 0;
            iVar13 = 1;
            goto LAB_014f0458;
          }
          SVar3 = getRandom<deqp::gls::GLValue::WrappedType<short>>(&rnd,min.m_value,max.m_value);
          iVar13 = 1;
          if (componentCount != 3) {
            SVar4 = getRandom<deqp::gls::GLValue::WrappedType<short>>(&rnd,min.m_value,max.m_value);
            iVar13 = (uint)(ushort)SVar4.m_value - (int)SVar4.m_value % (int)uVar7;
          }
          unaff_R12D = (uint)(ushort)SVar3.m_value - (int)SVar3.m_value % (int)uVar7;
          local_c0 = (short)iVar11;
          fVar26 = (float)(int)(short)unaff_R12D + (float)(int)local_c0;
          uVar25 = -(uint)(-fVar26 <= fVar26);
        } while ((float)(~uVar25 & (uint)-fVar26 | (uint)fVar26 & uVar25) <
                 (float)(int)min_00.m_value);
        local_a8 = (short)iVar12;
        fVar26 = (float)(int)(short)iVar13 + (float)(int)local_a8;
        uVar25 = -(uint)(-fVar26 <= fVar26);
      } while ((float)(~uVar25 & (uint)-fVar26 | (uint)fVar26 & uVar25) < (float)(int)min_00.m_value
              );
LAB_014f0458:
      iVar15 = iVar6 * (int)uVar19;
      sVar1 = (short)iVar10;
      sVar14 = (short)iVar11 + sVar1;
      *(short *)(pcVar8 + (long)iVar15 + (long)offset) = sVar1;
      sVar21 = (short)uVar23;
      *(short *)(pcVar8 + (long)(iVar15 + 2) + (long)offset) = sVar21;
      *(short *)(pcVar8 + (long)(iVar15 + iVar5) + (long)offset) = sVar14;
      *(short *)(pcVar8 + (long)(iVar15 + 2 + iVar5) + (long)offset) = sVar21;
      sVar17 = (short)iVar12 + sVar21;
      *(short *)(pcVar8 + (long)(iVar15 + iVar5 * 2) + (long)offset) = sVar1;
      *(short *)(pcVar8 + (long)(iVar15 + 2 + iVar5 * 2) + (long)offset) = sVar17;
      *(short *)(pcVar8 + (long)(iVar15 + iVar5 * 3) + (long)offset) = sVar1;
      *(short *)(pcVar8 + (long)(iVar15 + 2 + iVar5 * 3) + (long)offset) = sVar17;
      *(short *)(pcVar8 + (long)(iVar15 + iVar9) + (long)offset) = sVar14;
      *(short *)(pcVar8 + (long)(iVar15 + 2 + iVar9) + (long)offset) = sVar21;
      *(short *)(pcVar8 + (long)(iVar15 + iVar2) + (long)offset) = sVar14;
      *(short *)(pcVar8 + (long)(iVar15 + iVar2 + 2) + (long)offset) = sVar17;
      if (2 < componentCount) {
        lVar16 = 6;
        iVar15 = iVar20;
        while (bVar24 = lVar16 != 0, lVar16 = lVar16 + -1, bVar24) {
          *(short *)(pcVar8 + (long)iVar15 + (long)offset) = (short)unaff_R12D;
          iVar15 = iVar15 + iVar5;
        }
        if (componentCount != 3) {
          lVar16 = 6;
          iVar15 = iVar18;
          while (bVar24 = lVar16 != 0, lVar16 = lVar16 + -1, bVar24) {
            *(short *)(pcVar8 + (long)iVar15 + (long)offset) = (short)iVar13;
            iVar15 = iVar15 + iVar5;
          }
        }
      }
      iVar20 = iVar20 + iVar6;
      iVar18 = iVar18 + iVar6;
    }
  }
  return pcVar8;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}